

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

int deletePointAtIndex(DelaunayTriangulation *delTri,GLsizei i_p)

{
  GLfloat (*paGVar1) [2];
  long lVar2;
  GLfloat (*paGVar3) [2];
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  lVar2 = (long)delTri->n_points;
  if (lVar2 != 0) {
    delTri->n_points = (GLsizei)(lVar2 + -1);
    paGVar3 = (GLfloat (*) [2])malloc(lVar2 * 8 - 8);
    uVar4 = 0;
    uVar6 = 0;
    if (0 < i_p) {
      uVar6 = (ulong)(uint)i_p;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      paGVar1 = delTri->points;
      paGVar3[uVar4][0] = paGVar1[uVar4][0];
      paGVar3[uVar4][1] = paGVar1[uVar4][1];
    }
    paGVar1 = delTri->points;
    for (lVar5 = (long)i_p; lVar5 < lVar2 + -1; lVar5 = lVar5 + 1) {
      paGVar3[lVar5][0] = paGVar1[lVar5 + 1][0];
      paGVar3[lVar5][1] = paGVar1[lVar5 + 1][1];
    }
    free(paGVar1);
    delTri->points = paGVar3;
    resetDelaunayTriangulation(delTri);
    return 1;
  }
  return 0;
}

Assistant:

int deletePointAtIndex(DelaunayTriangulation *delTri, GLsizei i_p) {
	if (delTri->n_points == 0) {
		return 0;
	}

	delTri->n_points -= 1;
	GLfloat (*points)[2] = malloc(sizeof(delTri->points[0]) * delTri->n_points);

	for (GLsizei i = 0; i < i_p; i++) {
		points[i][0] = delTri->points[i][0];
		points[i][1] = delTri->points[i][1];
	}
	for (GLsizei i = i_p; i < delTri->n_points; i++) {
		points[i][0] = delTri->points[i + 1][0];
		points[i][1] = delTri->points[i + 1][1];
	}

	free(delTri->points);
	delTri->points = points;

	resetDelaunayTriangulation(delTri);
	return 1;
}